

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

int __thiscall
ADPlanner::CreateSearchStateSpace(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  void *pvVar1;
  CList *this_00;
  long in_RSI;
  long in_RDI;
  CHeap *in_stack_00000020;
  
  pvVar1 = operator_new(0x18);
  CHeap::CHeap(in_stack_00000020);
  *(void **)(in_RSI + 0x10) = pvVar1;
  this_00 = (CList *)operator_new(0x18);
  CList::CList(this_00);
  *(CList **)(in_RSI + 0x18) = this_00;
  *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + 0x18;
  *(int *)(in_RDI + 0x84) = *(int *)(in_RDI + 0x84) + 0x18;
  *(undefined8 *)(in_RSI + 0x28) = 0;
  *(undefined8 *)(in_RSI + 0x30) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined1 *)(in_RSI + 0x51) = 0;
  return 1;
}

Assistant:

int ADPlanner::CreateSearchStateSpace(ADSearchStateSpace_t* pSearchStateSpace)
{
    //create a heap
    pSearchStateSpace->heap = new CHeap;
    pSearchStateSpace->inconslist = new CList;
    MaxMemoryCounter += sizeof(CHeap);
    MaxMemoryCounter += sizeof(CList);

    pSearchStateSpace->searchgoalstate = NULL;
    pSearchStateSpace->searchstartstate = NULL;

    searchexpands = 0;

    pSearchStateSpace->bReinitializeSearchStateSpace = false;

    return 1;
}